

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O1

nghttp2_nv * Curl_dynhds_to_nva(dynhds *dynhds,size_t *pcount)

{
  size_t sVar1;
  dynhds_entry **ppdVar2;
  dynhds_entry *pdVar3;
  nghttp2_nv *pnVar4;
  uint8_t *puVar5;
  size_t sVar6;
  
  pnVar4 = (nghttp2_nv *)(*Curl_ccalloc)(1,dynhds->hds_len * 0x28);
  *pcount = 0;
  if (pnVar4 == (nghttp2_nv *)0x0) {
    pnVar4 = (nghttp2_nv *)0x0;
  }
  else {
    sVar1 = dynhds->hds_len;
    if (sVar1 != 0) {
      ppdVar2 = dynhds->hds;
      puVar5 = &pnVar4->flags;
      sVar6 = 0;
      do {
        pdVar3 = ppdVar2[sVar6];
        ((nghttp2_nv *)(puVar5 + -0x20))->name = (uint8_t *)pdVar3->name;
        *(size_t *)(puVar5 + -0x10) = pdVar3->namelen;
        *(char **)(puVar5 + -0x18) = pdVar3->value;
        *(size_t *)(puVar5 + -8) = pdVar3->valuelen;
        *puVar5 = '\0';
        sVar6 = sVar6 + 1;
        puVar5 = puVar5 + 0x28;
      } while (sVar1 != sVar6);
    }
    *pcount = sVar1;
  }
  return pnVar4;
}

Assistant:

nghttp2_nv *Curl_dynhds_to_nva(struct dynhds *dynhds, size_t *pcount)
{
  nghttp2_nv *nva = calloc(1, sizeof(nghttp2_nv) * dynhds->hds_len);
  size_t i;

  *pcount = 0;
  if(!nva)
    return NULL;

  for(i = 0; i < dynhds->hds_len; ++i) {
    struct dynhds_entry *e = dynhds->hds[i];
    DEBUGASSERT(e);
    nva[i].name = (unsigned char *)e->name;
    nva[i].namelen = e->namelen;
    nva[i].value = (unsigned char *)e->value;
    nva[i].valuelen = e->valuelen;
    nva[i].flags = NGHTTP2_NV_FLAG_NONE;
  }
  *pcount = dynhds->hds_len;
  return nva;
}